

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O2

void xc_lda_new(xc_func_type *func,int order,size_t np,double *rho,xc_lda_out_params *out)

{
  xc_lda_funcs_variants *pxVar1;
  xc_lda_funcs p_Var2;
  
  xc_lda_sanity_check(func->info,order,out);
  xc_lda_initalize(func,np,out);
  pxVar1 = func->info->lda;
  if (pxVar1 != (xc_lda_funcs_variants *)0x0) {
    if (func->nspin == 1) {
      p_Var2 = pxVar1->unpol[order];
    }
    else {
      p_Var2 = pxVar1->pol[order];
    }
    if (p_Var2 != (xc_lda_funcs)0x0) {
      (*p_Var2)(func,np,rho,out);
    }
  }
  if (func->mix_coef != (double *)0x0) {
    xc_mix_func(func,np,rho,0,0,0,*(undefined4 *)&out->zk,*(undefined4 *)&out->vrho,0,0,0,
                out->v2rho2,0,0,0,0,0,0,0,0,0,out->v3rho3,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,
                out->v4rho4,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0);
  }
  return;
}

Assistant:

void
xc_lda_new(const xc_func_type *func, int order, size_t np, const double *rho,
       xc_lda_out_params *out)
{
  xc_lda_sanity_check(func->info, order, out);
  xc_lda_initalize(func, np, out);

  /* call the LDA routines */
  if(func->info->lda != NULL){
    if(func->nspin == XC_UNPOLARIZED){
      if(func->info->lda->unpol[order] != NULL)
        func->info->lda->unpol[order](func, np, rho, out);
    }else{
      if(func->info->lda->pol[order] != NULL)
        func->info->lda->pol[order](func, np, rho, out);
    }
  }

  if(func->mix_coef != NULL)
    xc_mix_func(func, np, rho, NULL, NULL, NULL, out->zk, out->vrho, NULL, NULL, NULL,
                out->v2rho2, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                out->v3rho3, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                out->v4rho4, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL, NULL,
                NULL, NULL, NULL, NULL, NULL);
}